

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::RemoveLogSink(LogSink *destination)

{
  LogSink *destination_local;
  
  LogDestination::RemoveLogSink(destination);
  return;
}

Assistant:

void RemoveLogSink(LogSink* destination) {
  LogDestination::RemoveLogSink(destination);
}